

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_prespch_buf.c
# Opt level: O2

void fe_prespch_write_cep(prespch_buf_t *prespch_buf,mfcc_t *feat)

{
  short sVar1;
  
  memcpy(prespch_buf->cep_buf[prespch_buf->cep_write_ptr],feat,(long)prespch_buf->num_cepstra << 2);
  sVar1 = prespch_buf->num_frames_cep;
  prespch_buf->cep_write_ptr = (int16)((prespch_buf->cep_write_ptr + 1) % (int)sVar1);
  if (prespch_buf->ncep < sVar1) {
    prespch_buf->ncep = prespch_buf->ncep + 1;
  }
  else {
    prespch_buf->cep_read_ptr = (int16)((prespch_buf->cep_read_ptr + 1) % (int)sVar1);
  }
  return;
}

Assistant:

void
fe_prespch_write_cep(prespch_buf_t * prespch_buf, mfcc_t * feat)
{
    memcpy(prespch_buf->cep_buf[prespch_buf->cep_write_ptr], feat,
           sizeof(mfcc_t) * prespch_buf->num_cepstra);
    prespch_buf->cep_write_ptr = (prespch_buf->cep_write_ptr + 1) % prespch_buf->num_frames_cep;
    if (prespch_buf->ncep < prespch_buf->num_frames_cep) {
        prespch_buf->ncep++;	
    } else {
        prespch_buf->cep_read_ptr = (prespch_buf->cep_read_ptr + 1) % prespch_buf->num_frames_cep;
    }
}